

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O3

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
resizeLike<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
          (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *this,
          EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          *_other)

{
  ulong uVar1;
  void *pvVar2;
  undefined8 *puVar3;
  
  uVar1 = *(ulong *)(*(long *)(_other + 8) + 8);
  if ((long)uVar1 < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/PlainObjectBase.h"
                  ,0xf1,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (*(ulong *)(this + 8) != uVar1) {
    free(*(void **)this);
    if (uVar1 == 0) {
      pvVar2 = (void *)0x0;
    }
    else {
      if (uVar1 >> 0x3d != 0) {
LAB_0011296a:
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar3 = operator_delete;
        __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      pvVar2 = malloc(uVar1 * 8);
      if (pvVar2 == (void *)0x0) goto LAB_0011296a;
    }
    *(void **)this = pvVar2;
  }
  *(ulong *)(this + 8) = uVar1;
  return;
}

Assistant:

EIGEN_STRONG_INLINE Index rows() const { return m_storage.rows(); }